

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_thread.hpp
# Opt level: O1

void __thiscall
so_5::disp::prio_one_thread::reuse::
work_thread_template_t<so_5::disp::prio_one_thread::quoted_round_robin::impl::demand_queue_t,_so_5::disp::prio_one_thread::reuse::work_thread_details::no_activity_tracking_impl_t>
::body(work_thread_template_t<so_5::disp::prio_one_thread::quoted_round_robin::impl::demand_queue_t,_so_5::disp::prio_one_thread::reuse::work_thread_details::no_activity_tracking_impl_t>
       *this)

{
  __uniq_ptr_data<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>,_true,_true>
  in_RAX;
  pthread_t pVar1;
  at_exit_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sigman78[P]sobjectizer_so_5_disp_prio_one_thread_reuse_h_work_thread_hpp:216:7)>
  wait_meter_stopper;
  pointer *__ptr;
  demand_unique_ptr_t d;
  _Head_base<0UL,_so_5::disp::mpsc_queue_traits::lock_t_*,_false> local_18;
  
  local_18._M_head_impl =
       (lock_t *)
       in_RAX.
       super___uniq_ptr_impl<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>
       ._M_t.
       super__Tuple_impl<0UL,_so_5::disp::mpsc_queue_traits::lock_t_*,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>
       .super__Head_base<0UL,_so_5::disp::mpsc_queue_traits::lock_t_*,_false>._M_head_impl;
  pVar1 = pthread_self();
  *(pthread_t *)(this + 0x10) = pVar1;
  do {
    do {
      quoted_round_robin::impl::demand_queue_t::pop((demand_queue_t *)&stack0xffffffffffffffe8);
      (**(demand_handler_pfn_t *)((long)local_18._M_head_impl + 0x28))
                ((current_thread_id_t)*(native_handle_type *)(this + 0x10),
                 (execution_demand_t *)local_18._M_head_impl);
    } while ((demand_t *)local_18._M_head_impl == (demand_t *)0x0);
    std::default_delete<so_5::disp::prio_one_thread::quoted_round_robin::impl::demand_t>::operator()
              ((default_delete<so_5::disp::prio_one_thread::quoted_round_robin::impl::demand_t> *)
               &stack0xffffffffffffffe8,(demand_t *)local_18._M_head_impl);
  } while( true );
}

Assistant:

void
		body()
			{
				this->m_thread_id = so_5::query_current_thread_id();

				try
					{
						for(;;)
							{
								auto d = this->pop_demand();
								this->call_handler( *d );
							}
					}
				catch( const typename DEMAND_QUEUE::shutdown_ex_t & )
					{}
			}